

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.c
# Opt level: O0

void UpdateBits(size_t n_bits,uint32_t bits,size_t pos,uint8_t *array)

{
  sbyte sVar1;
  byte bVar2;
  ulong local_70;
  uint32_t changed_bits;
  uint32_t unchanged_bits;
  uint32_t mask;
  size_t total_bits;
  size_t n_changed_bits;
  size_t n_unchanged_bits;
  size_t byte_pos;
  uint8_t *array_local;
  size_t pos_local;
  size_t sStack_20;
  uint32_t bits_local;
  size_t n_bits_local;
  
  array_local = (uint8_t *)pos;
  pos_local._4_4_ = bits;
  for (sStack_20 = n_bits; sStack_20 != 0; sStack_20 = sStack_20 - local_70) {
    local_70 = 8 - ((ulong)array_local & 7);
    if (sStack_20 < local_70) {
      local_70 = sStack_20;
    }
    sVar1 = (sbyte)((ulong)array_local & 7);
    bVar2 = (byte)local_70;
    array[(ulong)array_local >> 3] =
         (byte)((pos_local._4_4_ & (1 << (bVar2 & 0x1f)) - 1U) << sVar1) |
         array[(ulong)array_local >> 3] &
         ((char)(1 << (sVar1 + bVar2 & 0x1f)) - 1U ^ 0xff | (char)(1 << sVar1) - 1U);
    pos_local._4_4_ = pos_local._4_4_ >> (bVar2 & 0x1f);
    array_local = array_local + local_70;
  }
  return;
}

Assistant:

static void UpdateBits(size_t n_bits, uint32_t bits, size_t pos,
    uint8_t* array) {
  while (n_bits > 0) {
    size_t byte_pos = pos >> 3;
    size_t n_unchanged_bits = pos & 7;
    size_t n_changed_bits = BROTLI_MIN(size_t, n_bits, 8 - n_unchanged_bits);
    size_t total_bits = n_unchanged_bits + n_changed_bits;
    uint32_t mask =
        (~((1u << total_bits) - 1u)) | ((1u << n_unchanged_bits) - 1u);
    uint32_t unchanged_bits = array[byte_pos] & mask;
    uint32_t changed_bits = bits & ((1u << n_changed_bits) - 1u);
    array[byte_pos] =
        (uint8_t)((changed_bits << n_unchanged_bits) | unchanged_bits);
    n_bits -= n_changed_bits;
    bits >>= n_changed_bits;
    pos += n_changed_bits;
  }
}